

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O1

int opj_getopt_long(int argc,char **argv,char *optstring,opj_option_t *longopts,int totlen)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  int unaff_R12D;
  long lVar11;
  
  cVar9 = '\x01';
  do {
    lVar6 = (long)opj_optind;
    iVar5 = -1;
    if (argc <= opj_optind) {
      return -1;
    }
    pcVar10 = argv[lVar6];
    if (pcVar10 == (char *)0x0) {
      return -1;
    }
    if (*pcVar10 != '-') {
      return -1;
    }
    if (pcVar10[1] == '\0') {
      if (opj_optind < argc + -1) {
        cVar9 = (*argv[lVar6 + 1] != '-') * '\x02';
      }
      else {
        cVar9 = '\0';
      }
    }
    if (cVar9 == '\x01') {
      pcVar10 = pcVar10 + 1;
LAB_0010fa03:
      sVar7 = strlen(pcVar10);
      iVar3 = opj_optind;
      if (sVar7 < 2) {
        if (*optstring != ':') {
          if (opj_getopt_long::lastidx != opj_optind) {
            opj_getopt_long::lastidx = opj_optind;
            opj_getopt_long::lastofs = 0;
          }
          iVar4 = opj_getopt_long::lastofs;
          lVar6 = (long)opj_optind;
          pcVar10 = argv[lVar6];
          lVar11 = (long)opj_getopt_long::lastofs;
          iVar5 = (int)pcVar10[lVar11 + 1];
          opj_optopt = iVar5;
          pcVar8 = strchr(optstring,iVar5);
          if (pcVar8 != (char *)0x0) {
            if (*pcVar8 == '\0') {
              opj_optind = iVar3 + 1;
              bVar2 = true;
            }
            else {
              if (pcVar8[1] != ':') {
                opj_getopt_long::lastofs = iVar4 + 1;
                goto LAB_0010fc2a;
              }
              if ((pcVar8[2] == ':') || (pcVar10[lVar11 + 2] != '\0')) {
                opj_optarg = (char *)0x0;
                if (pcVar10[lVar11 + 2] != '\0') {
                  opj_optarg = pcVar10 + lVar11 + 2;
                }
LAB_0010fbb0:
                opj_optind = opj_optind + 1;
                goto LAB_0010fc2a;
              }
              opj_optarg = argv[lVar6 + 1];
              if (((opj_optarg == (char *)0x0) || (*opj_optarg != '-')) || (opj_opterr == 0)) {
                if ((opj_optarg != (char *)0x0) || (opj_opterr == 0)) {
                  opj_optind = iVar3 + 1;
                  goto LAB_0010fbb0;
                }
                opj_getopt_long_cold_2();
              }
              else {
                opj_getopt_long_cold_1();
              }
              unaff_R12D = 0x3f;
              bVar2 = false;
            }
            goto LAB_0010fc4e;
          }
          opj_getopt_long_cold_3();
          goto LAB_0010fc37;
        }
        unaff_R12D = 0x3a;
      }
      else {
        if (0 < totlen) {
          lVar6 = 0;
          do {
            iVar5 = strcmp(*(char **)((long)&longopts->name + lVar6),pcVar10);
            if (iVar5 == 0) {
              iVar5 = *(int *)((long)&longopts->has_arg + lVar6);
              if (iVar5 == 0) {
                if ((argv[(long)opj_optind + 1] != (char *)0x0) &&
                   (*argv[(long)opj_optind + 1] != '-')) {
                  fprintf(_stderr,"%s: option does not require an argument. Ignoring %s\n",pcVar10);
                  goto LAB_0010fbc1;
                }
              }
              else {
                opj_optarg = argv[(long)opj_optind + 1];
                if (opj_optarg != (char *)0x0) {
                  if ((*opj_optarg == '-') && (opj_opterr != 0)) {
                    bVar2 = false;
                    fprintf(_stderr,"%s: option requires an argument\n",pcVar10);
                    unaff_R12D = 0x3f;
                    goto LAB_0010fc4e;
                  }
                  if (opj_optarg != (char *)0x0) goto LAB_0010fbc1;
                }
                if ((iVar5 == 1) && (opj_opterr != 0)) {
                  bVar2 = false;
                  fprintf(_stderr,"%s: option requires an argument \n",pcVar10);
                  unaff_R12D = 0x3f;
                  goto LAB_0010fc4e;
                }
LAB_0010fbc1:
                opj_optind = opj_optind + 1;
              }
              opj_optind = opj_optind + 1;
              piVar1 = *(int **)((long)&longopts->flag + lVar6);
              bVar2 = false;
              unaff_R12D = *(int *)((long)&longopts->val + lVar6);
              if (piVar1 != (int *)0x0) {
                *piVar1 = unaff_R12D;
                unaff_R12D = 0;
              }
              goto LAB_0010fc4e;
            }
            lVar6 = lVar6 + 0x20;
          } while ((int)lVar6 < totlen);
        }
        opj_getopt_long_cold_4();
LAB_0010fc37:
        unaff_R12D = 0x3f;
      }
      bVar2 = false;
    }
    else {
      if (cVar9 == '\0') {
        opj_optind = opj_optind + 1;
        return 0x3f;
      }
      if (opj_optind + 1 < argc) {
        pcVar10 = argv[lVar6 + 1];
        opj_optind = opj_optind + 1;
        goto LAB_0010fa03;
      }
LAB_0010fc2a:
      bVar2 = false;
      unaff_R12D = iVar5;
    }
LAB_0010fc4e:
    if (!bVar2) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

int opj_getopt_long(int argc, char * const argv[], const char *optstring,
                    const opj_option_t *longopts, int totlen)
{
    static int lastidx, lastofs;
    const char *tmp;
    int i, len;
    char param = 1;

again:
    if (opj_optind >= argc || !argv[opj_optind] || *argv[opj_optind] != '-') {
        return -1;
    }

    if (argv[opj_optind][0] == '-' && argv[opj_optind][1] == 0) {
        if (opj_optind >= (argc - 1)) { /* no more input parameters */
            param = 0;
        } else { /* more input parameters */
            if (argv[opj_optind + 1][0] == '-') {
                param = 0; /* Missing parameter after '-' */
            } else {
                param = 2;
            }
        }
    }

    if (param == 0) {
        ++opj_optind;
        return (BADCH);
    }

    if (argv[opj_optind][0] == '-') { /* long option */
        char* arg;
        const opj_option_t* o;
        o = longopts;
        len = sizeof(longopts[0]);

        if (param > 1) {
            if (opj_optind + 1 >= argc) {
                return -1;
            }
            arg = argv[opj_optind + 1];
            opj_optind++;
        } else {
            arg = argv[opj_optind] + 1;
        }

        if (strlen(arg) > 1) {
            for (i = 0; i < totlen; i = i + len, o++) {
                if (!strcmp(o->name, arg)) { /* match */
                    if (o->has_arg == 0) {
                        if ((argv[opj_optind + 1]) && (!(argv[opj_optind + 1][0] == '-'))) {
                            fprintf(stderr, "%s: option does not require an argument. Ignoring %s\n", arg,
                                    argv[opj_optind + 1]);
                            ++opj_optind;
                        }
                    } else {
                        opj_optarg = argv[opj_optind + 1];
                        if (opj_optarg) {
                            if (opj_optarg[0] ==
                                    '-') { /* Has read next input parameter: No arg for current parameter */
                                if (opj_opterr) {
                                    fprintf(stderr, "%s: option requires an argument\n", arg);
                                    return (BADCH);
                                }
                            }
                        }
                        if (!opj_optarg && o->has_arg == 1) { /* no argument there */
                            if (opj_opterr) {
                                fprintf(stderr, "%s: option requires an argument \n", arg);
                                return (BADCH);
                            }
                        }
                        ++opj_optind;
                    }
                    ++opj_optind;
                    if (o->flag) {
                        *(o->flag) = o->val;
                    } else {
                        return o->val;
                    }
                    return 0;
                }
            }/*(end for)String not found in the list*/
            fprintf(stderr, "Invalid option %s\n", arg);
            ++opj_optind;
            return (BADCH);
        } else { /*Single character input parameter*/
            if (*optstring == ':') {
                return ':';
            }
            if (lastidx != opj_optind) {
                lastidx = opj_optind;
                lastofs = 0;
            }
            opj_optopt = argv[opj_optind][lastofs + 1];
            if ((tmp = strchr(optstring, opj_optopt))) { /*Found input parameter in list*/
                if (*tmp == 0) { /* apparently, we looked for \0, i.e. end of argument */
                    ++opj_optind;
                    goto again;
                }
                if (tmp[1] == ':') { /* argument expected */
                    if (tmp[2] == ':' ||
                            argv[opj_optind][lastofs + 2]) { /* "-foo", return "oo" as opj_optarg */
                        if (!*(opj_optarg = argv[opj_optind] + lastofs + 2)) {
                            opj_optarg = 0;
                        }
                        goto found;
                    }
                    opj_optarg = argv[opj_optind + 1];
                    if (opj_optarg) {
                        if (opj_optarg[0] ==
                                '-') { /* Has read next input parameter: No arg for current parameter */
                            if (opj_opterr) {
                                fprintf(stderr, "%s: option requires an argument\n", arg);
                                ++opj_optind;
                                return (BADCH);
                            }
                        }
                    }
                    if (!opj_optarg) {  /* missing argument */
                        if (opj_opterr) {
                            fprintf(stderr, "%s: option requires an argument\n", arg);
                            ++opj_optind;
                            return (BADCH);
                        }
                    }
                    ++opj_optind;
                } else {/*Argument not expected*/
                    ++lastofs;
                    return opj_optopt;
                }
found:
                ++opj_optind;
                return opj_optopt;
            }   else {  /* not found */
                fprintf(stderr, "Invalid option %s\n", arg);
                ++opj_optind;
                return (BADCH);
            }/*end of not found*/

        }/* end of single character*/
    }/*end '-'*/
    fprintf(stderr, "Invalid option\n");
    ++opj_optind;
    return (BADCH);;
}